

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedElastic.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<7,_2>::MixedElastic::MixedElastic
          (MixedElastic *this,MixedElastic *param_1)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  CoherentElastic::CoherentElastic(&this->coherent_,&param_1->coherent_);
  uVar1 = *(undefined8 *)
           &(param_1->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>;
  lVar2 = ((_Head_base<4UL,_long,_false> *)
          ((long)&(param_1->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl;
  lVar3 = ((_Head_base<3UL,_long,_false> *)
          ((long)&(param_1->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl;
  lVar4 = ((_Head_base<2UL,_long,_false> *)
          ((long)&(param_1->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl;
  dVar5 = (param_1->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       ((_Head_base<1UL,_double,_false> *)
       ((long)&(param_1->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.fields
               .super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl;
  (this->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = dVar5;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl = lVar3;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl = lVar4;
  *(undefined8 *)
   &(this->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long> = uVar1;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->incoherent_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl = lVar2;
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->incoherent_).super_TabulationRecord.super_InterpolationBase.boundaryIndices,
             &(param_1->incoherent_).super_TabulationRecord.super_InterpolationBase.boundaryIndices)
  ;
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->incoherent_).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices,
             &(param_1->incoherent_).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->incoherent_).super_TabulationRecord.xValues,
             &(param_1->incoherent_).super_TabulationRecord.xValues);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->incoherent_).super_TabulationRecord.yValues,
             &(param_1->incoherent_).super_TabulationRecord.yValues);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT MixedElastic {

  /* fields */
  CoherentElastic coherent_;
  IncoherentElastic incoherent_;

public:

  /* constructor */
  #include "ENDFtk/section/7/2/MixedElastic/src/ctor.hpp"

  /**
   *  @brief Return the LTHR flag for mixed elastic scattering
   */
  static constexpr int LTHR() { return 3; }

  /**
   *  @brief Return the LTHR flag for mixed elastic scattering
   */
  int elasticScatteringType() const { return this->LTHR(); }

  /**
   *  @brief Return the coherent elastic scattering data
   */
  const CoherentElastic& coherent() const { return this->coherent_; }

  /**
   *  @brief Return the incoherent elastic scattering data
   */
  const IncoherentElastic& incoherent() const { return this->incoherent_; }

  #include "ENDFtk/section/7/2/MixedElastic/src/NC.hpp"
  #include "ENDFtk/section/7/2/MixedElastic/src/print.hpp"
}